

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O1

int ecx_readPDOmap(ecx_contextt *context,uint16 Slave,int *Osize,int *Isize)

{
  uint *puVar1;
  byte bVar2;
  int iVar3;
  uint8 uVar4;
  uint uVar5;
  ulong uVar6;
  uint8 uVar7;
  int *piVar8;
  char cVar9;
  char cVar10;
  long lVar11;
  uint8 local_4e;
  byte local_4d;
  int rdl;
  long local_48;
  int *local_40;
  int *local_38;
  
  *Isize = 0;
  *Osize = 0;
  rdl = 1;
  local_4d = 0;
  local_40 = Osize;
  local_38 = Isize;
  iVar3 = ecx_SDOread(context,Slave,0x1c00,'\0','\0',&rdl,&local_4d,700000);
  if (2 < local_4d && 0 < iVar3) {
    bVar2 = local_4d - 1;
    local_4d = 8;
    if (bVar2 < 8) {
      local_4d = bVar2;
    }
    local_48 = (ulong)Slave * 0x148;
    uVar6 = 8;
    if ((ulong)bVar2 < 8) {
      uVar6 = (ulong)bVar2;
    }
    lVar11 = 0;
    cVar9 = '\0';
    do {
      rdl = 1;
      local_4e = '\0';
      iVar3 = ecx_SDOread(context,Slave,0x1c00,(char)lVar11 + '\x03','\0',&rdl,&local_4e,700000);
      if (0 < iVar3) {
        cVar10 = cVar9;
        if (local_4e == '\x02') {
          cVar10 = '\x01';
        }
        if (lVar11 != 0) {
          cVar10 = cVar9;
        }
        if (local_4e != '\0') {
          local_4e = local_4e + cVar10;
        }
        uVar4 = local_4e;
        if (local_4e == '\0') {
          uVar4 = '\x03';
        }
        if (lVar11 != 0) {
          uVar4 = local_4e;
        }
        uVar7 = uVar4;
        if (uVar4 == '\0') {
          uVar7 = '\x04';
        }
        if (lVar11 != 1) {
          uVar7 = uVar4;
        }
        context->slavelist->SMtype[lVar11 + local_48 + 2] = uVar7;
        if (uVar7 == '\0') {
          puVar1 = (uint *)((long)&context->slavelist->SM[lVar11 + 2].SMflags + local_48);
          *puVar1 = *puVar1 & 0xfffeffff;
        }
        cVar9 = cVar10;
        if ((byte)(uVar7 - 3) < 2) {
          local_4e = uVar7;
          iVar3 = ecx_readPDOassign(context,Slave,(short)lVar11 + 0x1c12);
          if (iVar3 != 0) {
            uVar5 = iVar3 + 0xe;
            if (-1 < (int)(iVar3 + 7U)) {
              uVar5 = iVar3 + 7U;
            }
            piVar8 = local_38;
            if (uVar7 == '\x03') {
              piVar8 = local_40;
            }
            *(short *)((long)&context->slavelist->SM[lVar11 + 2].SMlength + local_48) =
                 (short)(uVar5 >> 3);
            *piVar8 = *piVar8 + iVar3;
          }
        }
      }
      lVar11 = lVar11 + 1;
    } while (uVar6 - 1 != lVar11);
  }
  if ((*local_38 < 1) && (*local_40 < 1)) {
    iVar3 = 0;
  }
  else {
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int ecx_readPDOmap(ecx_contextt *context, uint16 Slave, int *Osize, int *Isize)
{
   int wkc, rdl;
   int retVal = 0;
   uint8 nSM, iSM, tSM;
   int Tsize;
   uint8 SMt_bug_add;
   
   *Isize = 0;
   *Osize = 0;
   SMt_bug_add = 0;
   rdl = sizeof(nSM); nSM = 0;
   /* read SyncManager Communication Type object count */
   wkc = ecx_SDOread(context, Slave, ECT_SDO_SMCOMMTYPE, 0x00, FALSE, &rdl, &nSM, EC_TIMEOUTRXM);
   /* positive result from slave ? */
   if ((wkc > 0) && (nSM > 2))
   {
      /* make nSM equal to number of defined SM */
      nSM--;
      /* limit to maximum number of SM defined, if true the slave can't be configured */
      if (nSM > EC_MAXSM)
         nSM = EC_MAXSM;
      /* iterate for every SM type defined */
      for (iSM = 2 ; iSM <= nSM ; iSM++)
      {
         rdl = sizeof(tSM); tSM = 0;
         /* read SyncManager Communication Type */
         wkc = ecx_SDOread(context, Slave, ECT_SDO_SMCOMMTYPE, iSM + 1, FALSE, &rdl, &tSM, EC_TIMEOUTRXM);
         if (wkc > 0)
         {
// start slave bug prevention code, remove if possible            
            if((iSM == 2) && (tSM == 2)) // SM2 has type 2 == mailbox out, this is a bug in the slave!
            {   
               SMt_bug_add = 1; // try to correct, this works if the types are 0 1 2 3 and should be 1 2 3 4
            }
            if(tSM)
            {   
               tSM += SMt_bug_add; // only add if SMt > 0
            }
            if((iSM == 2) && (tSM == 0)) // SM2 has type 0, this is a bug in the slave!
            {   
               tSM = 3;
            }
            if((iSM == 3) && (tSM == 0)) // SM3 has type 0, this is a bug in the slave!
            {   
               tSM = 4;
            }
// end slave bug prevention code            

            context->slavelist[Slave].SMtype[iSM] = tSM;
            /* check if SM is unused -> clear enable flag */
            if (tSM == 0)
            {
               context->slavelist[Slave].SM[iSM].SMflags = 
                  htoel( etohl(context->slavelist[Slave].SM[iSM].SMflags) & EC_SMENABLEMASK);
            }
            if ((tSM == 3) || (tSM == 4))
            {
               /* read the assign PDO */
               Tsize = ecx_readPDOassign(context, Slave, ECT_SDO_PDOASSIGN + iSM );
               /* if a mapping is found */
               if (Tsize)
               {
                  context->slavelist[Slave].SM[iSM].SMlength = htoes((Tsize + 7) / 8);
                  if (tSM == 3)
                  {  
                     /* we are doing outputs */
                     *Osize += Tsize;
                  }
                  else
                  {
                     /* we are doing inputs */
                     *Isize += Tsize;
                  }   
               }   
            }   
         }   
      }
   }

   /* found some I/O bits ? */
   if ((*Isize > 0) || (*Osize > 0))
   {
      retVal = 1;
   }
      
   return retVal;
}